

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpIncludeDict
          (DictionaryPrinter *this,IncludeDict *include_dict)

{
  long lVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  long lVar4;
  allocator local_1b2;
  allocator local_1b1;
  _Rb_tree_node_base *local_1b0;
  TemplateDictionary *local_1a8;
  IndentedWriter *local_1a0;
  _Rb_tree_node_base *local_198;
  long local_190;
  ulong local_188;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string from_name;
  string local_120;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  sorted_include_dict;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SortSections<std::map<std::__cxx11::string,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*>>>,ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&sorted_include_dict,include_dict);
  p_Var2 = sorted_include_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0 = &this->writer_;
  while ((_Rb_tree_header *)p_Var2 != &sorted_include_dict._M_t._M_impl.super__Rb_tree_header) {
    local_198 = p_Var2 + 1;
    lVar4 = 0x100000000;
    uVar3 = 0;
    local_1b0 = p_Var2;
    while( true ) {
      lVar1 = *(long *)(*(long *)(local_1b0 + 2) + 8);
      if ((ulong)(*(long *)(*(long *)(local_1b0 + 2) + 0x10) - lVar1 >> 3) <= uVar3) break;
      local_1a8 = *(TemplateDictionary **)(lVar1 + uVar3 * 8);
      local_188 = uVar3;
      if ((local_1a8->filename_ == (char *)0x0) || (*local_1a8->filename_ == '\0')) {
        std::__cxx11::string::string
                  ((string *)&from_name,", **NO FILENAME SET; THIS DICT WILL BE IGNORED**",
                   (allocator *)&local_160);
      }
      else {
        std::__cxx11::string::string((string *)&local_160,", from ",&local_1b2);
        std::operator+(&from_name,&local_160,local_1a8->filename_);
        std::__cxx11::string::~string((string *)&local_160);
      }
      std::__cxx11::string::string((string *)&local_120,"include-template ",(allocator *)&local_160)
      ;
      std::__cxx11::string::string((string *)&local_70,(string *)local_198);
      std::__cxx11::string::string((string *)&local_50," (dict ",&local_1b2);
      GetDictNum_abi_cxx11_
                (&local_90,this,lVar4 >> 0x20,
                 *(long *)(*(long *)(local_1b0 + 2) + 0x10) -
                 *(long *)(*(long *)(local_1b0 + 2) + 8) >> 3);
      std::__cxx11::string::string((string *)&local_b0,(string *)&from_name);
      std::__cxx11::string::string((string *)&local_d0,") -->\n",&local_1b1);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      local_190 = lVar4;
      IndentedWriter::Write
                (&this->writer_,&local_120,&local_70,&local_50,&local_90,&local_b0,&local_d0,
                 &local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_120);
      this = (DictionaryPrinter *)local_1a0;
      IndentedWriter::Indent(local_1a0);
      DumpToString(this,local_1a8);
      IndentedWriter::Dedent(&this->writer_);
      std::__cxx11::string::~string((string *)&from_name);
      lVar4 = local_190 + 0x100000000;
      uVar3 = local_188 + 1;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(local_1b0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  ::~_Rb_tree(&sorted_include_dict._M_t);
  return;
}

Assistant:

void DumpIncludeDict(const IncludeDict& include_dict) {
    map<string, const DictVector*> sorted_include_dict;
    SortSections(&sorted_include_dict, include_dict);
    for (map<string, const DictVector*>::const_iterator it =
             sorted_include_dict.begin();
         it != sorted_include_dict.end();  ++it) {
      for (vector<TemplateDictionary*>::size_type i = 0;
           i < it->second->size();  ++i) {
        TemplateDictionary* dict = (*it->second)[i];
        string from_name = (dict->filename_ && *dict->filename_) ?
            string(", from ") + dict->filename_ :
            string(", **NO FILENAME SET; THIS DICT WILL BE IGNORED**");
        writer_.Write("include-template ", it->first, " (dict ",
                      GetDictNum(static_cast<int>(i + 1), it->second->size()),
                      from_name, ") -->\n");
        writer_.Indent();
        DumpToString(*dict);
        writer_.Dedent();
      }
    }
  }